

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O2

void __thiscall
klogic::mlmvn::load_neurons
          (mlmvn *this,cvector *all_weights,vector<int,_std::allocator<int>_> *k_values)

{
  long lVar1;
  long lVar2;
  runtime_error *this_00;
  ulong uVar3;
  size_t __n;
  pointer __src;
  ulong uVar4;
  long lVar5;
  pointer pvVar6;
  int *local_88;
  size_t n_neurons;
  mvn neuron;
  size_t n_weights;
  
  get_stats(this,&n_weights,&n_neurons);
  __src = (all_weights->
          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl.
          super__Vector_impl_data._M_start;
  if (((long)(all_weights->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish - (long)__src >> 4 != n_weights) ||
     (local_88 = (k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
     (long)(k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish - (long)local_88 >> 2 != n_neurons)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"klogic::mlmvn::load_neurons(): size mismatch");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = 0;
  while( true ) {
    pvVar6 = (this->neurons).
             super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->neurons).
                       super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18) <= uVar3)
    break;
    pvVar6 = pvVar6 + uVar3;
    lVar5 = 0;
    for (uVar4 = 0;
        lVar1 = *(long *)&(pvVar6->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>).
                          _M_impl,
        uVar4 < (ulong)((long)*(pointer *)
                               ((long)&(pvVar6->
                                       super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>
                                       )._M_impl + 8) - lVar1 >> 5); uVar4 = uVar4 + 1) {
      lVar2 = *(long *)(lVar1 + 8 + lVar5);
      lVar1 = *(long *)(lVar1 + lVar5);
      mvn::mvn(&neuron,*local_88,(int)((ulong)(lVar2 - lVar1) >> 4) + -1);
      __n = lVar2 - lVar1;
      if (__n != 0) {
        memmove(neuron.weights.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start,__src,__n);
      }
      mvn::operator=((mvn *)(*(long *)&(pvVar6->
                                       super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>
                                       )._M_impl + lVar5),&neuron);
      __src = (pointer)((long)__src + __n);
      local_88 = local_88 + 1;
      std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
                ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 &neuron);
      lVar5 = lVar5 + 0x20;
    }
    uVar3 = uVar3 + 1;
  }
  if (__src == (all_weights->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish) {
    if (local_88 ==
        (k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      return;
    }
    __assert_fail("it_k == k_values.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc"
                  ,0xda,
                  "void klogic::mlmvn::load_neurons(const klogic::cvector &, const std::vector<int> &)"
                 );
  }
  __assert_fail("it_w == all_weights.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc",
                0xd9,
                "void klogic::mlmvn::load_neurons(const klogic::cvector &, const std::vector<int> &)"
               );
}

Assistant:

void klogic::mlmvn::load_neurons(const klogic::cvector &all_weights, const std::vector<int> &k_values)
{
    size_t n_weights, n_neurons;

    get_stats(n_weights, n_neurons);

    if (all_weights.size() != n_weights || k_values.size() != n_neurons)
        throw std::runtime_error("klogic::mlmvn::load_neurons(): size mismatch");

    klogic::cvector::const_iterator  it_w = all_weights.begin();
    std::vector<int>::const_iterator it_k = k_values.begin();

    for (int layer = 0; layer < layers_count(); ++layer) {
        vector<mvn> &layer_neurons = neurons[layer];

        for (int k = 0; k < layer_neurons.size(); ++k) {
            // Neuron [(k+1), (layer+1)]
            size_t w = layer_neurons[k].weights_vector().size();
            mvn neuron(*it_k, w - 1);

            copy(it_w, it_w + w, neuron.weights_vector().begin());

            layer_neurons[k] = neuron;

            it_w += w;
            ++it_k;
        }
    }

    assert(it_w == all_weights.end());
    assert(it_k == k_values.end());
}